

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O2

MppSThd mpp_sthd_grp_get_each(MppSThdGrp grp,RK_S32 idx)

{
  if (grp == (MppSThdGrp)0x0) {
    _mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"impl",
               "mpp_sthd_grp_get_each",0x29c);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00169bf7;
  }
  if ((idx < 0) || (*(int *)((long)grp + 0x10) <= idx)) {
    _mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,
               "idx >= 0 && idx < impl->count","mpp_sthd_grp_get_each",0x29d);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00169bf7:
      abort();
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)grp + 0x18));
  pthread_mutex_unlock((pthread_mutex_t *)((long)grp + 0x18));
  return (MppSThd)((long)grp + (long)idx * 0x88 + 0x40);
}

Assistant:

MppSThd mpp_sthd_grp_get_each(MppSThdGrp grp, RK_S32 idx)
{
    MppSThdGrpImpl *impl = (MppSThdGrpImpl *)grp;
    MppSThd ret = NULL;

    mpp_assert(impl);
    mpp_assert(idx >= 0 && idx < impl->count);

    pthread_mutex_lock(&impl->lock);
    ret = &impl->thds[idx];
    pthread_mutex_unlock(&impl->lock);

    return ret;
}